

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_add_trampoline(pt_block_cache *bcache,uint64_t ip,uint64_t nip,pt_exec_mode mode)

{
  int iVar1;
  long lVar2;
  int64_t disp;
  pt_bcache_entry bce;
  pt_exec_mode mode_local;
  uint64_t nip_local;
  uint64_t ip_local;
  pt_block_cache *bcache_local;
  
  lVar2 = nip - ip;
  disp._4_4_ = mode;
  _bce = nip;
  memset(&disp,0,4);
  disp._0_4_ = (pt_bcache_entry)
               ((uint)disp._0_4_ & 0xe0000000 | (uint)lVar2 & 0xffff | 0x10000 |
               (disp._4_4_ & ptem_64bit) << 0x18);
  if ((int)(short)lVar2 != lVar2) {
    memset(&disp,0,4);
    disp._0_4_ = (pt_bcache_entry)
                 ((uint)disp._0_4_ & 0xe000ffff | 0x10000 | (disp._4_4_ & ptem_64bit) << 0x18 |
                 0x14000000);
  }
  iVar1 = pt_bcache_add(bcache,ip,disp._0_4_);
  return iVar1;
}

Assistant:

static inline int pt_blk_add_trampoline(struct pt_block_cache *bcache,
					uint64_t ip, uint64_t nip,
					enum pt_exec_mode mode)
{
	struct pt_bcache_entry bce;
	int64_t disp;

	/* The displacement from @ip to @nip for the trampoline. */
	disp = (int64_t) (nip - ip);

	memset(&bce, 0, sizeof(bce));
	bce.displacement = (int32_t) disp;
	bce.ninsn = 1;
	bce.mode = mode;
	bce.qualifier = ptbq_again;

	/* If we can't reach @nip without overflowing the displacement field, we
	 * have to stop and re-decode the instruction at @ip.
	 */
	if ((int64_t) bce.displacement != disp) {

		memset(&bce, 0, sizeof(bce));
		bce.ninsn = 1;
		bce.mode = mode;
		bce.qualifier = ptbq_decode;
	}

	return pt_bcache_add(bcache, ip, bce);
}